

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_mergeBlockDelimiters(ZSTD_Sequence *sequences,size_t seqsSize)

{
  uint uVar1;
  ZSTD_Sequence *pZVar2;
  ZSTD_Sequence *pZVar3;
  size_t out;
  size_t in;
  size_t seqsSize_local;
  ZSTD_Sequence *sequences_local;
  
  out = 0;
  for (in = 0; in < seqsSize; in = in + 1) {
    if ((sequences[in].offset == 0) && (sequences[in].matchLength == 0)) {
      if (in != seqsSize - 1) {
        sequences[in + 1].litLength = sequences[in].litLength + sequences[in + 1].litLength;
      }
    }
    else {
      pZVar3 = sequences + in;
      pZVar2 = sequences + out;
      uVar1 = pZVar3->litLength;
      pZVar2->offset = pZVar3->offset;
      pZVar2->litLength = uVar1;
      uVar1 = pZVar3->rep;
      pZVar2->matchLength = pZVar3->matchLength;
      pZVar2->rep = uVar1;
      out = out + 1;
    }
  }
  return out;
}

Assistant:

size_t ZSTD_mergeBlockDelimiters(ZSTD_Sequence* sequences, size_t seqsSize) {
    size_t in = 0;
    size_t out = 0;
    for (; in < seqsSize; ++in) {
        if (sequences[in].offset == 0 && sequences[in].matchLength == 0) {
            if (in != seqsSize - 1) {
                sequences[in+1].litLength += sequences[in].litLength;
            }
        } else {
            sequences[out] = sequences[in];
            ++out;
        }
    }
    return out;
}